

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void EMIT_REG_KILL(CodeGenGenericContext *ctx,x86Reg reg)

{
  EMIT_OP_REG(ctx,o_kill_register,reg);
  return;
}

Assistant:

void EMIT_REG_KILL(CodeGenGenericContext &ctx, x86Reg reg)
{
#ifdef NULLC_OPTIMIZE_X86
	EMIT_OP_REG(ctx, o_kill_register, reg);
#else
	(void)ctx;
	(void)reg;
#endif
}